

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

uint16_t __thiscall icu_63::Normalizer2Impl::nextFCD16(Normalizer2Impl *this,UChar **s,UChar *limit)

{
  UChar *pUVar1;
  UBool UVar2;
  uint16_t uVar3;
  uint local_2c;
  UChar c2;
  UChar32 c;
  UChar *limit_local;
  UChar **s_local;
  Normalizer2Impl *this_local;
  
  pUVar1 = *s;
  *s = pUVar1 + 1;
  local_2c = (uint)(ushort)*pUVar1;
  if (((ushort)this->minDecompNoCP <= local_2c) &&
     (UVar2 = singleLeadMightHaveNonZeroFCD16(this,local_2c), UVar2 != '\0')) {
    if (((local_2c & 0xfffffc00) == 0xd800) && ((*s != limit && ((**s & 0xfc00U) == 0xdc00)))) {
      local_2c = local_2c * 0x400 + (uint)(ushort)**s + 0xfca02400;
      *s = *s + 1;
    }
    uVar3 = getFCD16FromNormData(this,local_2c);
    return uVar3;
  }
  return 0;
}

Assistant:

uint16_t nextFCD16(const UChar *&s, const UChar *limit) const {
        UChar32 c=*s++;
        if(c<minDecompNoCP || !singleLeadMightHaveNonZeroFCD16(c)) {
            return 0;
        }
        UChar c2;
        if(U16_IS_LEAD(c) && s!=limit && U16_IS_TRAIL(c2=*s)) {
            c=U16_GET_SUPPLEMENTARY(c, c2);
            ++s;
        }
        return getFCD16FromNormData(c);
    }